

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_discharge(FuncState *fs,ExpDesc *e)

{
  uint reg;
  BCPos BVar1;
  FuncState *in_RSI;
  FuncState *in_RDI;
  BCReg rc;
  BCIns ins;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  if (*(int *)&in_RSI->ls != 7) {
    if (*(int *)&in_RSI->ls == 8) {
      const_str(in_RSI,(ExpDesc *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    }
    else {
      if (*(int *)&in_RSI->ls != 9) {
        if (*(int *)&in_RSI->ls == 0xd) {
          *(undefined4 *)&in_RSI->kt = *(undefined4 *)((long)&in_RSI->kt + 4);
          *(undefined4 *)&in_RSI->ls = 0xc;
          return;
        }
        if (*(int *)&in_RSI->ls != 6) {
          return;
        }
        *(undefined4 *)&in_RSI->ls = 0xc;
        return;
      }
      reg = *(uint *)((long)&in_RSI->kt + 4);
      if ((-1 < (int)reg) && (reg < 0x100)) {
        bcreg_free(in_RDI,reg);
      }
      bcreg_free(in_RDI,*(BCReg *)&in_RSI->kt);
    }
  }
  BVar1 = bcemit_INS(_rc,(BCIns)((ulong)in_RDI >> 0x20));
  *(BCPos *)&in_RSI->kt = BVar1;
  *(undefined4 *)&in_RSI->ls = 0xb;
  return;
}

Assistant:

static void expr_discharge(FuncState *fs, ExpDesc *e)
{
  BCIns ins;
  if (e->k == VUPVAL) {
    ins = BCINS_AD(BC_UGET, 0, e->u.s.info);
  } else if (e->k == VGLOBAL) {
    ins = BCINS_AD(BC_GGET, 0, const_str(fs, e));
  } else if (e->k == VINDEXED) {
    BCReg rc = e->u.s.aux;
    if ((int32_t)rc < 0) {
      ins = BCINS_ABC(BC_TGETS, 0, e->u.s.info, ~rc);
    } else if (rc > BCMAX_C) {
      ins = BCINS_ABC(BC_TGETB, 0, e->u.s.info, rc-(BCMAX_C+1));
    } else {
      bcreg_free(fs, rc);
      ins = BCINS_ABC(BC_TGETV, 0, e->u.s.info, rc);
    }
    bcreg_free(fs, e->u.s.info);
  } else if (e->k == VCALL) {
    e->u.s.info = e->u.s.aux;
    e->k = VNONRELOC;
    return;
  } else if (e->k == VLOCAL) {
    e->k = VNONRELOC;
    return;
  } else {
    return;
  }
  e->u.s.info = bcemit_INS(fs, ins);
  e->k = VRELOCABLE;
}